

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cswTable.c
# Opt level: O0

Aig_Obj_t * Csw_TableCutLookup(Csw_Man_t *p,Csw_Cut_t *pCut)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  uint *pIn0;
  uint *pIn1;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  int iEntry;
  uint *pTruthOld;
  uint *pTruthNew;
  Csw_Cut_t *pEnt;
  Aig_Obj_t *pRes;
  Csw_Cut_t *pCut_local;
  Csw_Man_t *p_local;
  
  uVar2 = Csw_CutHash(pCut);
  pTruthNew = (uint *)p->pTable[(int)(uVar2 % (uint)p->nTableSize)];
  do {
    if (pTruthNew == (uint *)0x0) {
      return (Aig_Obj_t *)0x0;
    }
    if (((*(char *)((long)pTruthNew + 0x17) == pCut->nFanins) && (pTruthNew[3] == pCut->uSign)) &&
       (iVar3 = memcmp(pTruthNew + 6,pCut + 1,(long)pCut->nFanins << 2), iVar3 == 0)) {
      pIn0 = Csw_CutTruth((Csw_Cut_t *)pTruthNew);
      pIn1 = Csw_CutTruth(pCut);
      if ((*pIn0 & 1) == (*pIn1 & 1)) {
        iVar3 = Kit_TruthIsEqual(pIn0,pIn1,(int)pCut->nFanins);
        if (iVar3 != 0) {
          pAVar4 = Aig_ManObj(p->pManRes,pTruthNew[4]);
          uVar1 = *(ulong *)&pAVar4->field_0x18;
          pAVar5 = Aig_ManObj(p->pManRes,pCut->iNode);
          if (((uint)(uVar1 >> 3) & 1) == ((uint)(*(ulong *)&pAVar5->field_0x18 >> 3) & 1)) {
            return pAVar4;
          }
          __assert_fail("pRes->fPhase == Aig_ManObj( p->pManRes, pCut->iNode )->fPhase",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/csw/cswTable.c"
                        ,0x8e,"Aig_Obj_t *Csw_TableCutLookup(Csw_Man_t *, Csw_Cut_t *)");
        }
      }
      else {
        iVar3 = Kit_TruthIsOpposite(pIn0,pIn1,(int)pCut->nFanins);
        if (iVar3 != 0) {
          pAVar4 = Aig_ManObj(p->pManRes,pTruthNew[4]);
          pAVar4 = Aig_Not(pAVar4);
          pAVar5 = Aig_Regular(pAVar4);
          uVar1 = *(ulong *)&pAVar5->field_0x18;
          pAVar5 = Aig_ManObj(p->pManRes,pCut->iNode);
          if (((uint)(uVar1 >> 3) & 1) != ((uint)(*(ulong *)&pAVar5->field_0x18 >> 3) & 1)) {
            return pAVar4;
          }
          __assert_fail("Aig_Regular(pRes)->fPhase != Aig_ManObj( p->pManRes, pCut->iNode )->fPhase"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/csw/cswTable.c"
                        ,0x97,"Aig_Obj_t *Csw_TableCutLookup(Csw_Man_t *, Csw_Cut_t *)");
        }
      }
    }
    pTruthNew = *(uint **)pTruthNew;
  } while( true );
}

Assistant:

Aig_Obj_t * Csw_TableCutLookup( Csw_Man_t * p, Csw_Cut_t * pCut )
{
    Aig_Obj_t * pRes = NULL;
    Csw_Cut_t * pEnt;
    unsigned * pTruthNew, * pTruthOld;
    int iEntry = Csw_CutHash(pCut) % p->nTableSize;
    for ( pEnt = p->pTable[iEntry]; pEnt; pEnt = pEnt->pNext )
    {
        if ( pEnt->nFanins != pCut->nFanins )
            continue;
        if ( pEnt->uSign != pCut->uSign )
            continue;
        if ( memcmp( pEnt->pFanins, pCut->pFanins, sizeof(int) * pCut->nFanins ) )
            continue;
        pTruthOld = Csw_CutTruth(pEnt);
        pTruthNew = Csw_CutTruth(pCut);
        if ( (pTruthOld[0] & 1) == (pTruthNew[0] & 1) )
        {
            if ( Kit_TruthIsEqual( pTruthOld, pTruthNew, pCut->nFanins ) )
            {
                pRes = Aig_ManObj( p->pManRes, pEnt->iNode );
                assert( pRes->fPhase == Aig_ManObj( p->pManRes, pCut->iNode )->fPhase );
                break;
            }
        }
        else
        {
            if ( Kit_TruthIsOpposite( pTruthOld, pTruthNew, pCut->nFanins ) )
            {
                pRes = Aig_Not( Aig_ManObj( p->pManRes, pEnt->iNode ) );
                assert( Aig_Regular(pRes)->fPhase != Aig_ManObj( p->pManRes, pCut->iNode )->fPhase );
                break;
            }
        }
    }
    return pRes;
}